

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

UBool __thiscall
icu_63::FractionalPartSubstitution::doParse
          (FractionalPartSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double param_4,UBool lenientParse,uint32_t nonNumericalExecutedRuleMask,
          Formattable *resVal)

{
  UBool UVar1;
  int8_t value;
  undefined4 uVar2;
  uint uVar4;
  NumberFormat *pNVar5;
  undefined7 in_register_00000009;
  undefined8 uVar6;
  int iVar7;
  double dVar8;
  double d;
  UErrorCode status;
  ParsePosition workPos;
  UnicodeString workText;
  DecimalQuantity dl;
  Formattable temp;
  UErrorCode local_16c;
  NumberFormat *local_168;
  ParsePosition local_160;
  FractionalPartSubstitution *local_150;
  undefined4 local_148;
  uint32_t local_144;
  Formattable *local_140;
  double local_138;
  UnicodeString local_130;
  DecimalQuantity local_f0;
  Formattable local_a0;
  int32_t iVar3;
  
  if (this->byDigits == '\0') {
    UVar1 = NFSubstitution::doParse
                      (&this->super_NFSubstitution,text,parsePosition,baseValue,0.0,lenientParse,
                       nonNumericalExecutedRuleMask,resVal);
    return UVar1;
  }
  local_138 = baseValue;
  UnicodeString::UnicodeString(&local_130,text);
  local_160.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003f3fd8;
  local_160.index = 1;
  local_160.errorIndex = -1;
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&local_f0);
  uVar2 = local_130.fUnion.fFields.fLength;
  if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
    uVar2 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  iVar7 = 0;
  if ((0 < (int)uVar2) && (iVar7 = 0, local_160.index != 0)) {
    local_148 = (undefined4)CONCAT71(in_register_00000009,lenientParse);
    local_168 = (NumberFormat *)0x0;
    iVar7 = 0;
    local_150 = this;
    local_144 = nonNumericalExecutedRuleMask;
    local_140 = resVal;
    do {
      local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
      Formattable::Formattable(&local_a0);
      NFRuleSet::parse((local_150->super_NFSubstitution).ruleSet,&local_130,&local_160,10.0,
                       local_144,&local_a0);
      local_16c = U_ZERO_ERROR;
      iVar3 = Formattable::getLong(&local_a0,&local_16c);
      value = (int8_t)iVar3;
      if ((char)local_148 == '\0') {
LAB_00269af5:
        if (local_160.index != 0) goto LAB_00269b00;
      }
      else {
        if (local_160.index == 0) {
          pNVar5 = local_168;
          if (local_168 == (NumberFormat *)0x0) {
            local_16c = U_ZERO_ERROR;
            pNVar5 = NumberFormat::createInstance(&local_16c);
            if (local_16c < U_ILLEGAL_ARGUMENT_ERROR) {
              if (pNVar5 != (NumberFormat *)0x0) goto LAB_00269a90;
            }
            else if (pNVar5 != (NumberFormat *)0x0) {
              (*(pNVar5->super_Format).super_UObject._vptr_UObject[1])(pNVar5);
            }
            local_168 = (NumberFormat *)0x0;
          }
          else {
LAB_00269a90:
            local_168 = pNVar5;
            (*(pNVar5->super_Format).super_UObject._vptr_UObject[0x14])
                      (pNVar5,&local_130,&local_a0,&local_160);
            iVar3 = Formattable::getLong(&local_a0,&local_16c);
            value = (int8_t)iVar3;
          }
          goto LAB_00269af5;
        }
LAB_00269b00:
        icu_63::number::impl::DecimalQuantity::appendDigit(&local_f0,value,0,true);
        parsePosition->index = parsePosition->index + local_160.index;
        UnicodeString::doReplace(&local_130,0,local_160.index,(UChar *)0x0,0,0);
        uVar4 = (uint)local_130.fUnion.fStackFields.fLengthAndFlags;
        uVar2 = local_130.fUnion.fFields.fLength;
        if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
          uVar2 = (int)uVar4 >> 5;
        }
        iVar7 = iVar7 + 1;
        while (0 < (int)uVar2) {
          uVar6 = local_130.fUnion.fStackFields.fBuffer;
          if ((uVar4 & 2) == 0) {
            uVar6 = local_130.fUnion.fFields.fArray;
          }
          if (*(char16_t *)uVar6 != L' ') break;
          UnicodeString::doReplace(&local_130,0,1,(UChar *)0x0,0,0);
          parsePosition->index = parsePosition->index + 1;
          uVar4 = (uint)local_130.fUnion.fStackFields.fLengthAndFlags;
          uVar2 = local_130.fUnion.fFields.fLength;
          if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
            uVar2 = (int)uVar4 >> 5;
          }
        }
      }
      Formattable::~Formattable(&local_a0);
      uVar2 = local_130.fUnion.fFields.fLength;
      if (-1 < local_130.fUnion.fStackFields.fLengthAndFlags) {
        uVar2 = (int)local_130.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
    } while ((0 < (int)uVar2) && (local_160.index != 0));
    resVal = local_140;
    this = local_150;
    if (local_168 != (NumberFormat *)0x0) {
      (*(local_168->super_Format).super_UObject._vptr_UObject[1])();
      resVal = local_140;
      this = local_150;
    }
  }
  icu_63::number::impl::DecimalQuantity::adjustMagnitude(&local_f0,-iVar7);
  dVar8 = icu_63::number::impl::DecimalQuantity::toDouble(&local_f0);
  (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xb])(dVar8,local_138,this);
  Formattable::setDouble(resVal,d);
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_f0);
  ParsePosition::~ParsePosition(&local_160);
  UnicodeString::~UnicodeString(&local_130);
  return '\x01';
}

Assistant:

UBool
FractionalPartSubstitution::doParse(const UnicodeString& text,
                ParsePosition& parsePosition,
                double baseValue,
                double /*upperBound*/,
                UBool lenientParse,
                uint32_t nonNumericalExecutedRuleMask,
                Formattable& resVal) const
{
    // if we're not in byDigits mode, we can just use the inherited
    // doParse()
    if (!byDigits) {
        return NFSubstitution::doParse(text, parsePosition, baseValue, 0, lenientParse, nonNumericalExecutedRuleMask, resVal);

        // if we ARE in byDigits mode, parse the text one digit at a time
        // using this substitution's owning rule set (we do this by setting
        // upperBound to 10 when calling doParse() ) until we reach
        // nonmatching text
    } else {
        UnicodeString workText(text);
        ParsePosition workPos(1);
        double result = 0;
        int32_t digit;
//          double p10 = 0.1;

        DecimalQuantity dl;
        int32_t totalDigits = 0;
        NumberFormat* fmt = NULL;
        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            Formattable temp;
            getRuleSet()->parse(workText, workPos, 10, nonNumericalExecutedRuleMask, temp);
            UErrorCode status = U_ZERO_ERROR;
            digit = temp.getLong(status);
//            digit = temp.getType() == Formattable::kLong ?
//               temp.getLong() :
//            (int32_t)temp.getDouble();

            if (lenientParse && workPos.getIndex() == 0) {
                if (!fmt) {
                    status = U_ZERO_ERROR;
                    fmt = NumberFormat::createInstance(status);
                    if (U_FAILURE(status)) {
                        delete fmt;
                        fmt = NULL;
                    }
                }
                if (fmt) {
                    fmt->parse(workText, temp, workPos);
                    digit = temp.getLong(status);
                }
            }

            if (workPos.getIndex() != 0) {
                dl.appendDigit(static_cast<int8_t>(digit), 0, true);
                totalDigits++;
//                  result += digit * p10;
//                  p10 /= 10;
                parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
                workText.removeBetween(0, workPos.getIndex());
                while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                    workText.removeBetween(0, 1);
                    parsePosition.setIndex(parsePosition.getIndex() + 1);
                }
            }
        }
        delete fmt;

        dl.adjustMagnitude(-totalDigits);
        result = dl.toDouble();
        result = composeRuleValue(result, baseValue);
        resVal.setDouble(result);
        return TRUE;
    }
}